

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getaddrinfo.c
# Opt level: O1

int uv_getaddrinfo(uv_loop_t *loop,uv_getaddrinfo_t *req,uv_getaddrinfo_cb cb,char *hostname,
                  char *service,addrinfo *hints)

{
  long *plVar1;
  sockaddr *psVar2;
  addrinfo *paVar3;
  socklen_t sVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  addrinfo *paVar12;
  long lVar13;
  char *pcVar14;
  
  iVar9 = -0x16;
  if ((cb != (uv_getaddrinfo_cb)0x0 && req != (uv_getaddrinfo_t *)0x0) &&
     (hostname != (char *)0x0 || service != (char *)0x0)) {
    if (hostname == (char *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen(hostname);
      sVar10 = sVar10 + 1;
    }
    if (service == (char *)0x0) {
      sVar11 = 0;
    }
    else {
      sVar11 = strlen(service);
      sVar11 = sVar11 + 1;
    }
    lVar13 = 0x30;
    if (hints == (addrinfo *)0x0) {
      lVar13 = 0;
    }
    paVar12 = (addrinfo *)malloc(lVar13 + sVar11 + sVar10);
    if (paVar12 == (addrinfo *)0x0) {
      iVar9 = -0xc;
    }
    else {
      req->type = UV_GETADDRINFO;
      req->active_queue[0] = loop->active_reqs;
      plVar1 = (long *)loop->active_reqs[1];
      req->active_queue[1] = plVar1;
      *plVar1 = (long)req->active_queue;
      loop->active_reqs[1] = req->active_queue;
      req->loop = loop;
      req->cb = cb;
      req->hints = (addrinfo *)0x0;
      req->hostname = (char *)0x0;
      req->service = (char *)0x0;
      req->res = (addrinfo *)0x0;
      req->retcode = 0;
      if (hints == (addrinfo *)0x0) {
        lVar13 = 0;
      }
      else {
        iVar9 = hints->ai_flags;
        iVar6 = hints->ai_family;
        iVar7 = hints->ai_socktype;
        iVar8 = hints->ai_protocol;
        sVar4 = hints->ai_addrlen;
        uVar5 = *(undefined4 *)&hints->field_0x14;
        psVar2 = hints->ai_addr;
        paVar3 = hints->ai_next;
        paVar12->ai_canonname = hints->ai_canonname;
        paVar12->ai_next = paVar3;
        paVar12->ai_addrlen = sVar4;
        *(undefined4 *)&paVar12->field_0x14 = uVar5;
        paVar12->ai_addr = psVar2;
        paVar12->ai_flags = iVar9;
        paVar12->ai_family = iVar6;
        paVar12->ai_socktype = iVar7;
        paVar12->ai_protocol = iVar8;
        req->hints = paVar12;
        lVar13 = 0x30;
      }
      if (service != (char *)0x0) {
        pcVar14 = (char *)((long)&paVar12->ai_flags + lVar13);
        memcpy(pcVar14,service,sVar11);
        req->service = pcVar14;
        lVar13 = lVar13 + sVar11;
      }
      if (hostname != (char *)0x0) {
        pcVar14 = (char *)((long)&paVar12->ai_flags + lVar13);
        memcpy(pcVar14,hostname,sVar10);
        req->hostname = pcVar14;
      }
      uv__work_submit(loop,&req->work_req,uv__getaddrinfo_work,uv__getaddrinfo_done);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int uv_getaddrinfo(uv_loop_t* loop,
                   uv_getaddrinfo_t* req,
                   uv_getaddrinfo_cb cb,
                   const char* hostname,
                   const char* service,
                   const struct addrinfo* hints) {
  size_t hostname_len;
  size_t service_len;
  size_t hints_len;
  size_t len;
  char* buf;

  if (req == NULL || cb == NULL || (hostname == NULL && service == NULL))
    return -EINVAL;

  hostname_len = hostname ? strlen(hostname) + 1 : 0;
  service_len = service ? strlen(service) + 1 : 0;
  hints_len = hints ? sizeof(*hints) : 0;
  buf = malloc(hostname_len + service_len + hints_len);

  if (buf == NULL)
    return -ENOMEM;

  uv__req_init(loop, req, UV_GETADDRINFO);
  req->loop = loop;
  req->cb = cb;
  req->res = NULL;
  req->hints = NULL;
  req->service = NULL;
  req->hostname = NULL;
  req->retcode = 0;

  /* order matters, see uv_getaddrinfo_done() */
  len = 0;

  if (hints) {
    req->hints = memcpy(buf + len, hints, sizeof(*hints));
    len += sizeof(*hints);
  }

  if (service) {
    req->service = memcpy(buf + len, service, service_len);
    len += service_len;
  }

  if (hostname) {
    req->hostname = memcpy(buf + len, hostname, hostname_len);
    len += hostname_len;
  }

  uv__work_submit(loop,
                  &req->work_req,
                  uv__getaddrinfo_work,
                  uv__getaddrinfo_done);

  return 0;
}